

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_extract_all.cpp
# Opt level: O3

void duckdb::RegexpExtractAll::Execute(DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pcVar5;
  data_ptr_t pdVar6;
  byte bVar7;
  _Head_base<0UL,_duckdb_re2::RE2_*,_false> _Var8;
  Vector *pVVar9;
  _Head_base<0UL,_duckdb::RegexStringPieceArgs_*,_false> _Var10;
  _Alloc_hider _Var11;
  size_type sVar12;
  ExpressionState *state_00;
  bool bVar13;
  int32_t iVar14;
  BoundFunctionExpression *pBVar15;
  reference this_00;
  reference this_01;
  Vector *pVVar16;
  RE2 *pRVar17;
  InvalidInputException *pIVar18;
  ulong uVar19;
  long lVar20;
  pointer pRVar21;
  pointer this_02;
  RegexStringPieceArgs *args_00;
  idx_t iVar22;
  TemplatedValidityData<unsigned_long> *pTVar23;
  _Head_base<0UL,_unsigned_long_*,_false> _Var24;
  VectorBuffer *__tmp;
  RegexpBaseBindData *pRVar25;
  long lVar26;
  idx_t idx_in_entry;
  ulong row;
  bool bVar27;
  int32_t group_index;
  StringPiece pattern_strpiece;
  UnifiedVectorFormat pattern_data;
  UnifiedVectorFormat strings_data;
  _Head_base<0UL,_duckdb_re2::RE2_*,_false> local_180;
  Vector *local_178;
  DataChunk *local_170;
  _Head_base<0UL,_duckdb::RegexStringPieceArgs_*,_false> local_168;
  RegexpBaseBindData *local_160;
  ulong local_158;
  int32_t local_14c;
  string local_148;
  ExpressionState *local_128;
  StringPiece local_120;
  buffer_ptr<ValidityBuffer> *local_110;
  Options *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  local_128 = state;
  pBVar15 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  local_160 = (RegexpBaseBindData *)
              unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
              operator->(&pBVar15->bind_info);
  this_00 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  this_01 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  local_178 = result;
  pVVar16 = ListVector::GetEntry(result);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  local_170 = args;
  Vector::ToUnifiedFormat(this_00,args->count,&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(this_01,local_170->count,&local_c0);
  ListVector::Reserve(local_178,0x800);
  pRVar25 = local_160;
  peVar3 = (this_00->auxiliary).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this_00->auxiliary).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  (pVVar16->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar3;
  this = (pVVar16->auxiliary).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pVVar16->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var4;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  bVar13 = DataChunk::AllConstant(local_170);
  local_158 = 1;
  if (!bVar13) {
    local_158 = local_170->count;
  }
  local_168._M_head_impl = (RegexStringPieceArgs *)0x0;
  local_180._M_head_impl = (RE2 *)0x0;
  if (pRVar25->constant_pattern == false) {
    local_168._M_head_impl = (RegexStringPieceArgs *)operator_new(0x18);
    (local_168._M_head_impl)->size = 0;
    (local_168._M_head_impl)->capacity = 0;
    (local_168._M_head_impl)->group_buffer = (StringPiece *)0x0;
  }
  else {
    pRVar17 = GetPattern(pRVar25,local_128,
                         (unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true> *)
                         &local_180);
    if (pRVar17->num_captures_ == -1) {
      pIVar18 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"Pattern failed to parse, error: \'%s\'","");
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      pcVar5 = (pRVar17->error_->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar5,pcVar5 + pRVar17->error_->_M_string_length);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar18,&local_148,&local_e0);
      __cxa_throw(pIVar18,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if (local_158 != 0) {
    local_108 = &pRVar25->options;
    local_110 = &(local_178->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    lVar26 = 8;
    row = 0;
    do {
      bVar13 = true;
      if (pRVar25->constant_pattern == false) {
        uVar19 = row;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          uVar19 = (ulong)(local_c0.sel)->sel_vector[row];
        }
        if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar19 >> 6]
             >> (uVar19 & 0x3f) & 1) != 0)) {
          lVar20 = uVar19 * 0x10;
          local_120.size_ = (size_type)*(uint *)(local_c0.data + lVar20);
          if (local_120.size_ < 0xd) {
            local_120.data_ = (const_pointer)(local_c0.data + lVar20 + 4);
          }
          else {
            local_120.data_ = *(const_pointer *)(local_c0.data + lVar20 + 8);
          }
          pRVar17 = (RE2 *)operator_new(0x98);
          duckdb_re2::RE2::RE2(pRVar17,&local_120,local_108);
          _Var8._M_head_impl = local_180._M_head_impl;
          bVar27 = local_180._M_head_impl != (RE2 *)0x0;
          local_180._M_head_impl = pRVar17;
          if (bVar27) {
            duckdb_re2::RE2::~RE2(_Var8._M_head_impl);
            operator_delete(_Var8._M_head_impl);
          }
          pRVar21 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::
                    operator->((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>
                                *)&local_180);
          iVar2 = pRVar21->num_captures_;
          if ((long)iVar2 == 0xffffffffffffffff) {
            pIVar18 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Pattern failed to parse, error: \'%s\'","");
            pRVar21 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::
                      operator->((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>
                                  *)&local_180);
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            pcVar5 = (pRVar21->error_->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_100,pcVar5,pcVar5 + pRVar21->error_->_M_string_length);
            InvalidInputException::InvalidInputException<std::__cxx11::string>
                      (pIVar18,&local_148,&local_100);
            __cxa_throw(pIVar18,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          this_02 = unique_ptr<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>,_true>
                    ::operator->((unique_ptr<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>,_true>
                                  *)&local_168);
          RegexStringPieceArgs::SetSize(this_02,(long)iVar2);
        }
        else {
          bVar13 = false;
        }
      }
      uVar19 = row;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar19 = (ulong)(local_78.sel)->sel_vector[row];
      }
      if ((bVar13) &&
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar19 >> 6]
            >> (uVar19 & 0x3f) & 1) != 0)))) {
        iVar14 = GetGroupIndex(local_170,row,&local_14c);
        state_00 = local_128;
        pRVar25 = local_160;
        if (iVar14 == 0) goto LAB_00caef02;
        pRVar17 = GetPattern(local_160,local_128,
                             (unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>
                              *)&local_180);
        args_00 = GetGroupsBuffer(pRVar25,state_00,
                                  (unique_ptr<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>,_true>
                                   *)&local_168);
        ExtractSingleTuple((string_t *)(local_78.data + uVar19 * 0x10),pRVar17,local_14c,args_00,
                           local_178,row);
        pRVar25 = local_160;
      }
      else {
LAB_00caef02:
        pVVar16 = local_178;
        pdVar6 = local_178->data;
        FlatVector::VerifyFlatVector(local_178);
        pRVar25 = local_160;
        pdVar1 = pdVar6 + lVar26;
        pdVar1[0] = '\0';
        pdVar1[1] = '\0';
        pdVar1[2] = '\0';
        pdVar1[3] = '\0';
        pdVar1[4] = '\0';
        pdVar1[5] = '\0';
        pdVar1[6] = '\0';
        pdVar1[7] = '\0';
        iVar22 = ListVector::GetListSize(pVVar16);
        pVVar9 = local_178;
        *(idx_t *)(pdVar6 + lVar26 + -8) = iVar22;
        _Var24._M_head_impl =
             (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var24._M_head_impl == (unsigned_long *)0x0) {
          local_120.data_ =
               (const_pointer)
               (local_178->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_148,(unsigned_long *)&local_120);
          sVar12 = local_148._M_string_length;
          _Var11._M_p = local_148._M_dataplus._M_p;
          local_148._M_dataplus._M_p = (pointer)0x0;
          local_148._M_string_length = 0;
          p_Var4 = (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var11._M_p;
          (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar12;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length)
              ;
            }
          }
          pTVar23 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_110);
          _Var24._M_head_impl =
               (pTVar23->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (local_178->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var24._M_head_impl;
        }
        bVar7 = (byte)row & 0x3f;
        _Var24._M_head_impl[row >> 6] =
             _Var24._M_head_impl[row >> 6] & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      }
      row = row + 1;
      lVar26 = lVar26 + 0x10;
    } while (local_158 != row);
  }
  bVar13 = DataChunk::AllConstant(local_170);
  if (bVar13) {
    Vector::SetVectorType(local_178,CONSTANT_VECTOR);
  }
  _Var8._M_head_impl = local_180._M_head_impl;
  if (local_180._M_head_impl != (RE2 *)0x0) {
    duckdb_re2::RE2::~RE2(local_180._M_head_impl);
    operator_delete(_Var8._M_head_impl);
  }
  _Var10._M_head_impl = local_168._M_head_impl;
  if (local_168._M_head_impl != (RegexStringPieceArgs *)0x0) {
    RegexStringPieceArgs::~RegexStringPieceArgs(local_168._M_head_impl);
    operator_delete(_Var10._M_head_impl);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void RegexpExtractAll::Execute(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	const auto &info = func_expr.bind_info->Cast<RegexpBaseBindData>();

	auto &strings = args.data[0];
	auto &patterns = args.data[1];
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	auto &output_child = ListVector::GetEntry(result);

	UnifiedVectorFormat strings_data;
	strings.ToUnifiedFormat(args.size(), strings_data);

	UnifiedVectorFormat pattern_data;
	patterns.ToUnifiedFormat(args.size(), pattern_data);

	ListVector::Reserve(result, STANDARD_VECTOR_SIZE);
	// Reference the 'strings' StringBuffer, because we won't need to allocate new data
	// for the result, all returned strings are substrings of the originals
	output_child.SetAuxiliary(strings.GetAuxiliary());

	// Avoid doing extra work if all the inputs are constant
	idx_t tuple_count = args.AllConstant() ? 1 : args.size();

	unique_ptr<RegexStringPieceArgs> non_const_args;
	unique_ptr<duckdb_re2::RE2> stored_re;
	if (!info.constant_pattern) {
		non_const_args = make_uniq<RegexStringPieceArgs>();
	} else {
		// Verify that the constant pattern is valid
		auto &re = GetPattern(info, state, stored_re);
		auto group_count_p = re.NumberOfCapturingGroups();
		if (group_count_p == -1) {
			throw InvalidInputException("Pattern failed to parse, error: '%s'", re.error());
		}
	}

	for (idx_t row = 0; row < tuple_count; row++) {
		bool pattern_valid = true;
		if (!info.constant_pattern) {
			// Check if the pattern is NULL or not,
			// and compile the pattern if it's not constant
			auto pattern_idx = pattern_data.sel->get_index(row);
			if (!pattern_data.validity.RowIsValid(pattern_idx)) {
				pattern_valid = false;
			} else {
				auto &pattern_p = UnifiedVectorFormat::GetData<string_t>(pattern_data)[pattern_idx];
				auto pattern_strpiece = CreateStringPiece(pattern_p);
				stored_re = make_uniq<duckdb_re2::RE2>(pattern_strpiece, info.options);

				// Increase the size of the args buffer if needed
				auto group_count_p = stored_re->NumberOfCapturingGroups();
				if (group_count_p == -1) {
					throw InvalidInputException("Pattern failed to parse, error: '%s'", stored_re->error());
				}
				non_const_args->SetSize(UnsafeNumericCast<idx_t>(group_count_p));
			}
		}

		auto string_idx = strings_data.sel->get_index(row);
		int32_t group_index;
		if (!pattern_valid || !strings_data.validity.RowIsValid(string_idx) || !GetGroupIndex(args, row, group_index)) {
			// If something is NULL, the result is NULL
			// FIXME: do we even need 'SPECIAL_HANDLING'?
			auto result_data = FlatVector::GetData<list_entry_t>(result);
			auto &result_validity = FlatVector::Validity(result);
			result_data[row].length = 0;
			result_data[row].offset = ListVector::GetListSize(result);
			result_validity.SetInvalid(row);
			continue;
		}

		auto &re = GetPattern(info, state, stored_re);
		auto &groups = GetGroupsBuffer(info, state, non_const_args);
		auto &string = UnifiedVectorFormat::GetData<string_t>(strings_data)[string_idx];
		ExtractSingleTuple(string, re, group_index, groups, result, row);
	}

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}